

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

bool __thiscall
IntBoundCheck::SetBoundOffset(IntBoundCheck *this,int offset,bool isLoopCountBasedBound)

{
  Opnd *this_00;
  code *pcVar1;
  IntConstType left;
  bool bVar2;
  OpndKind OVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  IntConstOpnd *pIVar7;
  undefined7 in_register_00000011;
  BailOutKind BVar8;
  IntConstOpnd *this_01;
  IntConstType local_50;
  IntConstType newSrc1Value;
  IntConstType previousOffset;
  IntConstType offsetDecrease;
  
  BVar8 = (BailOutKind)CONCAT71(in_register_00000011,isLoopCountBasedBound);
  if (this->leftValueNumber == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x2e5,"(IsValid())","IsValid()");
    if (!bVar2) goto LAB_005617f6;
    *puVar5 = 0;
  }
  newSrc1Value = 0;
  pIVar6 = this->instr;
  pIVar7 = (IntConstOpnd *)pIVar6->m_dst;
  if (pIVar7 == (IntConstOpnd *)0x0) {
    offsetDecrease._7_1_ = TyInt64;
  }
  else {
    OVar3 = IR::Opnd::GetKind((Opnd *)pIVar7);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) goto LAB_005617f6;
      *puVar5 = 0;
    }
    newSrc1Value = (pIVar7->super_EncodableOpnd<long>).m_value;
    offsetDecrease._7_1_ = (pIVar7->super_Opnd).m_type;
    pIVar6 = this->instr;
  }
  left = newSrc1Value;
  OVar3 = IR::Opnd::GetKind(pIVar6->m_src1);
  if (OVar3 == OpndKindIntConst) {
    this_01 = (IntConstOpnd *)this->instr->m_src1;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      offsetDecrease._0_4_ = BVar8;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) goto LAB_005617f6;
      *puVar5 = 0;
      BVar8 = (BailOutKind)offsetDecrease;
    }
    bVar2 = IntConstMath::Sub(left,(this_01->super_EncodableOpnd<long>).m_value,
                              (this_01->super_Opnd).m_type,&newSrc1Value);
    if (bVar2) {
      return false;
    }
    offsetDecrease._7_1_ = (this_01->super_Opnd).m_type;
  }
  else {
    this_01 = (IntConstOpnd *)0x0;
  }
  OVar3 = IR::Opnd::GetKind(this->instr->m_src2);
  if (OVar3 == OpndKindIntConst) {
    this_00 = this->instr->m_src2;
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      offsetDecrease._0_4_ = BVar8;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) goto LAB_005617f6;
      *puVar5 = 0;
      BVar8 = (BailOutKind)offsetDecrease;
    }
    bVar2 = IntConstMath::Add(newSrc1Value,(IntConstType)this_00[1]._vptr_Opnd,this_00->m_type,
                              &newSrc1Value);
    if (bVar2) {
      return false;
    }
  }
  if (newSrc1Value <= offset) {
    return true;
  }
  bVar2 = IntConstMath::Sub(newSrc1Value,(long)offset,offsetDecrease._7_1_,&previousOffset);
  if (bVar2) {
    return false;
  }
  if (previousOffset < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x309,"(offsetDecrease > 0)","offsetDecrease > 0");
    if (!bVar2) {
LAB_005617f6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (this_01 == (IntConstOpnd *)0x0) {
    if (pIVar7 == (IntConstOpnd *)0x0) {
      pIVar6 = this->instr;
      pIVar7 = IR::IntConstOpnd::New(-previousOffset,TyInt64,pIVar6->m_func,true);
      IR::Instr::SetDst(pIVar6,&pIVar7->super_Opnd);
      goto LAB_005617bb;
    }
    bVar2 = IntConstMath::Sub((pIVar7->super_EncodableOpnd<long>).m_value,previousOffset,
                              (pIVar7->super_Opnd).m_type,&local_50);
    if (bVar2) {
      return false;
    }
    this_01 = pIVar7;
    if (local_50 == 0) {
      IR::Instr::FreeDst(this->instr);
      goto LAB_005617bb;
    }
  }
  else {
    bVar2 = IntConstMath::Add((this_01->super_EncodableOpnd<long>).m_value,previousOffset,
                              (this_01->super_Opnd).m_type,&local_50);
    if (bVar2) {
      return false;
    }
  }
  IR::IntConstOpnd::SetValue(this_01,local_50);
LAB_005617bb:
  BVar4 = IR::Instr::GetBailOutKind(this->instr);
  if (BVar4 == BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
    return true;
  }
  if (BVar4 == BailOutOnFailedHoistedBoundCheck) {
    if ((char)BVar8 == '\0') {
      return true;
    }
    pIVar6 = this->instr;
    BVar8 = BailOutOnFailedHoistedLoopCountBasedBoundCheck;
  }
  else {
    pIVar6 = this->instr;
    BVar8 = BVar8 & 0xff | BailOutOnFailedHoistedBoundCheck;
  }
  IR::Instr::SetBailOutKind(pIVar6,BVar8);
  return true;
}

Assistant:

bool IntBoundCheck::SetBoundOffset(const int offset, const bool isLoopCountBasedBound) const
{
    Assert(IsValid());

    // Determine the previous offset from the instruction (src1 <= src2 + dst)
    IR::IntConstOpnd *dstOpnd = nullptr;
    IntConstType previousOffset = 0;
    IRType offsetType = TyMachReg;
    if (instr->GetDst())
    {
        dstOpnd = instr->GetDst()->AsIntConstOpnd();
        previousOffset = dstOpnd->GetValue();
        offsetType = dstOpnd->GetType();
    }

    IR::IntConstOpnd *src1Opnd = nullptr;
    if (instr->GetSrc1()->IsIntConstOpnd())
    {
        src1Opnd = instr->GetSrc1()->AsIntConstOpnd();
        if (IntConstMath::Sub(previousOffset, src1Opnd->GetValue(), src1Opnd->GetType(), &previousOffset))
            return false;
        offsetType = src1Opnd->GetType();
    }

    IR::IntConstOpnd *src2Opnd = (instr->GetSrc2()->IsIntConstOpnd() ? instr->GetSrc2()->AsIntConstOpnd() : nullptr);
    if(src2Opnd && IntConstMath::Add(previousOffset, src2Opnd->GetValue(), src2Opnd->GetType(), &previousOffset))
        return false;

    // Given a bounds check (a <= b + offset), the offset may only be decreased such that it does not invalidate the invariant
    // previously established by the check. If the offset needs to be increased, that requirement is already satisfied by the
    // previous check.
    if(offset >= previousOffset)
        return true;

    IntConstType offsetDecrease;
    if(IntConstMath::Sub(previousOffset, offset, offsetType, &offsetDecrease))
        return false;

    Assert(offsetDecrease > 0);
    if(src1Opnd)
    {
        // Prefer to increase src1, as this is an upper bound check and src1 corresponds to the index
        IntConstType newSrc1Value;
        if(IntConstMath::Add(src1Opnd->GetValue(), offsetDecrease, src1Opnd->GetType(), &newSrc1Value))
            return false;
        src1Opnd->SetValue(newSrc1Value);
    }
    else if(dstOpnd)
    {
        IntConstType newDstValue;
        if(IntConstMath::Sub(dstOpnd->GetValue(), offsetDecrease, dstOpnd->GetType(), &newDstValue))
            return false;
        if (newDstValue == 0)
            instr->FreeDst();
        else
            dstOpnd->SetValue(newDstValue);
    }
    else
        instr->SetDst(IR::IntConstOpnd::New(-offsetDecrease, TyMachReg, instr->m_func, true));

    switch(instr->GetBailOutKind())
    {
        case IR::BailOutOnFailedHoistedBoundCheck:
            if(isLoopCountBasedBound)
                instr->SetBailOutKind(IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);
            break;

        case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
            break;

        default:
            instr->SetBailOutKind(
                isLoopCountBasedBound
                    ? IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck
                    : IR::BailOutOnFailedHoistedBoundCheck);
            break;
    }
    return true;
}